

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_ASYM_SCHEME_Unmarshal
                 (TPMU_ASYM_SCHEME *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_ASYM_SCHEME *target_local;
  
  switch(selector) {
  case 0x10:
    target_local._4_4_ = 0;
    break;
  default:
    target_local._4_4_ = 0x98;
    break;
  case 0x14:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
    break;
  case 0x15:
    target_local._4_4_ = TPMS_EMPTY_Unmarshal(&target->rsaes,buffer,size);
    break;
  case 0x16:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
    break;
  case 0x17:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
    break;
  case 0x18:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
    break;
  case 0x19:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
    break;
  case 0x1a:
    target_local._4_4_ = TPMS_SCHEME_ECDAA_Unmarshal((TPMS_SCHEME_ECDAA *)&target->ecdh,buffer,size)
    ;
    break;
  case 0x1c:
    target_local._4_4_ = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&target->rsaes,buffer,size,0);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_ASYM_SCHEME_Unmarshal(TPMU_ASYM_SCHEME *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_ECDH
        case TPM_ALG_ECDH:
            return TPMS_KEY_SCHEME_ECDH_Unmarshal((TPMS_KEY_SCHEME_ECDH *)&(target->ecdh), buffer, size);
#endif // ALG_ECDH
#if         ALG_ECMQV
        case TPM_ALG_ECMQV:
            return TPMS_KEY_SCHEME_ECMQV_Unmarshal((TPMS_KEY_SCHEME_ECMQV *)&(target->ecmqv), buffer, size);
#endif // ALG_ECMQV
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
            return TPMS_SIG_SCHEME_ECDAA_Unmarshal((TPMS_SIG_SCHEME_ECDAA *)&(target->ecdaa), buffer, size);
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
            return TPMS_SIG_SCHEME_RSASSA_Unmarshal((TPMS_SIG_SCHEME_RSASSA *)&(target->rsassa), buffer, size);
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
            return TPMS_SIG_SCHEME_RSAPSS_Unmarshal((TPMS_SIG_SCHEME_RSAPSS *)&(target->rsapss), buffer, size);
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
            return TPMS_SIG_SCHEME_ECDSA_Unmarshal((TPMS_SIG_SCHEME_ECDSA *)&(target->ecdsa), buffer, size);
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
            return TPMS_SIG_SCHEME_SM2_Unmarshal((TPMS_SIG_SCHEME_SM2 *)&(target->sm2), buffer, size);
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
            return TPMS_SIG_SCHEME_ECSCHNORR_Unmarshal((TPMS_SIG_SCHEME_ECSCHNORR *)&(target->ecschnorr), buffer, size);
#endif // ALG_ECSCHNORR
#if         ALG_RSAES
        case TPM_ALG_RSAES:
            return TPMS_ENC_SCHEME_RSAES_Unmarshal((TPMS_ENC_SCHEME_RSAES *)&(target->rsaes), buffer, size);
#endif // ALG_RSAES
#if         ALG_OAEP
        case TPM_ALG_OAEP:
            return TPMS_ENC_SCHEME_OAEP_Unmarshal((TPMS_ENC_SCHEME_OAEP *)&(target->oaep), buffer, size);
#endif // ALG_OAEP
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}